

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

int __thiscall
TPZSFMatrix<long_double>::Subst_LForward(TPZSFMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar3;
  int64_t i;
  long lVar4;
  longdouble *plVar5;
  int64_t j;
  long lVar6;
  longdouble *pk;
  longdouble *plVar7;
  int64_t k;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_6c;
  longdouble local_48;
  
  lVar8 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar8 == CONCAT44(extraout_var,iVar2)) &&
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\0')) {
    iVar2 = (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(B);
    if (iVar2 != 0) {
      TPZMatrix<long_double>::Error
                ("virtual int TPZSFMatrix<long double>::Subst_LForward(TPZFMatrix<TVar> *) const [TVar = long double]"
                 ,"Subst_LForward <the matrix result can not be simetric>");
    }
    plVar5 = this->fElem;
    lVar8 = 0;
    while( true ) {
      iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar2) <= lVar8) break;
      for (lVar6 = 0; lVar6 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
          lVar6 = lVar6 + 1) {
        local_6c = (longdouble)0;
        plVar7 = plVar5;
        lVar9 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
          lVar1 = *plVar7;
          plVar7 = plVar7 + 1;
          (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(B,lVar4,lVar6);
          local_6c = local_6c + lVar1 * lVar9;
          lVar9 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
        }
        (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(B,lVar8,lVar6);
        local_48 = lVar9 - local_6c;
        in_ST6 = in_ST5;
        (*(B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,lVar8,lVar6,&local_48);
      }
      lVar8 = lVar8 + 1;
      plVar5 = plVar5 + lVar8;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
TPZSFMatrix<TVar> ::Subst_LForward( TPZFMatrix<TVar>  *B ) const
{
	if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
		return( 0 );
	
	if ( B->IsSymmetric() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Subst_LForward <the matrix result can not be simetric>" );
	
	TVar *ptr_k = fElem;
	for ( int64_t k = 0; k < this->Dim(); k++, ptr_k += k )
		for ( int64_t j = 0; j < B->Cols(); j++ )
		{
			// Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
			//
			TVar *pk = ptr_k;
			TVar sum = 0.0;
			for ( int64_t i = 0; i < k; i++ )
				sum += (*pk++) * B->GetVal( i, j );
			
			// Faz b[k] = (b[k] - sum).
			//
			B->PutVal( k, j, B->GetVal( k, j ) - sum );
		}
	
	return( 1 );
}